

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O0

bool __thiscall ADSBHubConnection::StreamProcessDataVRSLine(ADSBHubConnection *this,uint8_t *pStart)

{
  bool bVar1;
  logLevelTy lVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  byte *pbVar6;
  double *pdVar7;
  byte *in_RSI;
  long in_RDI;
  float fVar8;
  double dVar9;
  uint8_t flags;
  uint8_t fields;
  FDKeyTy key;
  uint8_t *pEnd;
  size_t len;
  ADSBHubConnection *in_stack_000001c0;
  undefined2 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeea;
  undefined1 in_stack_fffffffffffffeeb;
  byte bVar10;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined8 in_stack_ffffffffffffff28;
  FDKeyTy *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  string local_90 [36];
  undefined4 local_6c;
  byte local_66;
  byte local_65;
  FDKeyTy local_58;
  byte *local_28;
  
  uVar5 = (ulong)*in_RSI;
  if (uVar5 < 10) {
    lVar2 = DataRefs::GetLogLevel(&dataRefs);
    if ((int)lVar2 < 1) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
             ,0x207,"StreamProcessDataVRSLine",logDEBUG,"Ignoring too short a message of length %d",
             uVar5 & 0xffffffff);
    }
    bVar10 = 0;
    goto LAB_0018b015;
  }
  local_28 = in_RSI + uVar5;
  pbVar6 = in_RSI + 4;
  LTFlightData::FDKeyTy::FDKeyTy
            (in_stack_ffffffffffffff30,(FDKeyType)((ulong)in_stack_ffffffffffffff28 >> 0x20),
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  pbVar6 = pbVar6 + 3;
  bVar1 = LTFlightData::FDKeyTy::operator!=((FDKeyTy *)(in_RDI + 0x2a0),&local_58);
  if (bVar1) {
    ProcessPlaneData(in_stack_000001c0);
    LTFlightData::FDKeyTy::operator=
              ((FDKeyTy *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (FDKeyTy *)
               CONCAT44(in_stack_fffffffffffffeec,
                        CONCAT13(in_stack_fffffffffffffeeb,
                                 CONCAT12(in_stack_fffffffffffffeea,in_stack_fffffffffffffee8))));
  }
  local_65 = *pbVar6;
  local_66 = pbVar6[1];
  pbVar6 = pbVar6 + 2;
  if (local_28 < pbVar6) {
    lVar2 = DataRefs::GetLogLevel(&dataRefs);
    if ((int)lVar2 < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
             ,0x223,"StreamProcessDataVRSLine",logERR,"Line too short, no fields processed");
    }
    bVar10 = 0;
  }
  else {
    if ((local_65 & 1) != 0) {
      if (local_28 < pbVar6 + ((ulong)*pbVar6 - 1)) {
        lVar2 = DataRefs::GetLogLevel(&dataRefs);
        if ((int)lVar2 < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
                 ,0x227,"StreamProcessDataVRSLine",logERR,"Line too short for next value Call Sign")
          ;
        }
        bVar10 = 0;
        goto LAB_0018b008;
      }
      VRSString_abi_cxx11_
                ((uint8_t **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      std::__cxx11::string::operator=((string *)(in_RDI + 0x3a8),local_90);
      std::__cxx11::string::~string(local_90);
    }
    if ((local_65 & 2) != 0) {
      if (local_28 < pbVar6 + 2) {
        lVar2 = DataRefs::GetLogLevel(&dataRefs);
        if ((int)lVar2 < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
                 ,0x22d,"StreamProcessDataVRSLine",logERR,"Line too short for next value Altitude");
        }
        bVar10 = 0;
        goto LAB_0018b008;
      }
      VRSFloatInt((uint8_t **)&stack0xffffffffffffffe8);
      positionTy::SetAltFt
                ((positionTy *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (double)CONCAT44(in_stack_fffffffffffffeec,
                                  CONCAT13(in_stack_fffffffffffffeeb,
                                           CONCAT12(in_stack_fffffffffffffeea,
                                                    in_stack_fffffffffffffee8))));
    }
    if ((local_65 & 4) != 0) {
      if (local_28 < pbVar6 + 1) {
        lVar2 = DataRefs::GetLogLevel(&dataRefs);
        if ((int)lVar2 < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
                 ,0x233,"StreamProcessDataVRSLine",logERR,
                 "Line too short for next value Ground Speed");
        }
        bVar10 = 0;
        goto LAB_0018b008;
      }
      iVar3 = VRSFloatShort((uint8_t **)&stack0xffffffffffffffe8);
      *(double *)(in_RDI + 0x490) = (double)iVar3;
    }
    if ((local_65 & 8) != 0) {
      if (local_28 < pbVar6 + 1) {
        lVar2 = DataRefs::GetLogLevel(&dataRefs);
        if ((int)lVar2 < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
                 ,0x239,"StreamProcessDataVRSLine",logERR,"Line too short for next value Track");
        }
        bVar10 = 0;
        goto LAB_0018b008;
      }
      iVar3 = VRSFloatShort((uint8_t **)&stack0xffffffffffffffe8);
      dVar9 = (double)iVar3 / 10.0;
      *(double *)(in_RDI + 0x488) = dVar9;
      pdVar7 = positionTy::heading((positionTy *)(in_RDI + 0x4b0));
      *pdVar7 = dVar9;
    }
    if ((local_65 & 0x10) != 0) {
      if (local_28 < pbVar6 + 3) {
        lVar2 = DataRefs::GetLogLevel(&dataRefs);
        if ((int)lVar2 < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
                 ,0x23f,"StreamProcessDataVRSLine",logERR,"Line too short for next value Latitude");
        }
        bVar10 = 0;
        goto LAB_0018b008;
      }
      fVar8 = VRSFloat((uint8_t **)&stack0xffffffffffffffe8);
      pdVar7 = positionTy::lat((positionTy *)(in_RDI + 0x4b0));
      *pdVar7 = (double)fVar8;
    }
    if ((local_65 & 0x20) != 0) {
      if (local_28 < pbVar6 + 3) {
        lVar2 = DataRefs::GetLogLevel(&dataRefs);
        if ((int)lVar2 < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
                 ,0x245,"StreamProcessDataVRSLine",logERR,"Line too short for next value Longitude")
          ;
        }
        bVar10 = 0;
        goto LAB_0018b008;
      }
      fVar8 = VRSFloat((uint8_t **)&stack0xffffffffffffffe8);
      pdVar7 = positionTy::lon((positionTy *)(in_RDI + 0x4b0));
      *pdVar7 = (double)fVar8;
    }
    if ((local_65 & 0x40) != 0) {
      if (local_28 < pbVar6 + 1) {
        lVar2 = DataRefs::GetLogLevel(&dataRefs);
        if ((int)lVar2 < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
                 ,0x24b,"StreamProcessDataVRSLine",logERR,"Line too short for next value VSI");
        }
        bVar10 = 0;
        goto LAB_0018b008;
      }
      iVar3 = VRSFloatShort((uint8_t **)&stack0xffffffffffffffe8);
      *(double *)(in_RDI + 0x498) = (double)iVar3;
    }
    if ((local_65 & 0x80) != 0) {
      if (local_28 < pbVar6 + 1) {
        lVar2 = DataRefs::GetLogLevel(&dataRefs);
        if ((int)lVar2 < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
                 ,0x251,"StreamProcessDataVRSLine",logERR,"Line too short for next value Squawk");
        }
        bVar10 = 0;
        goto LAB_0018b008;
      }
      uVar4 = VRSShort((uint8_t **)&stack0xffffffffffffffe8);
      *(ulong *)(in_RDI + 0x470) = (ulong)uVar4;
    }
    if (local_66 != 0) {
      if (local_28 < pbVar6) {
        lVar2 = DataRefs::GetLogLevel(&dataRefs);
        if ((int)lVar2 < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
                 ,599,"StreamProcessDataVRSLine",logERR,"Line too short for next value Flags");
        }
        bVar10 = 0;
        goto LAB_0018b008;
      }
      if ((local_66 & 8) != 0) {
        bVar10 = 2;
        if ((*pbVar6 & 8) == 0) {
          bVar10 = 1;
        }
        *(ushort *)(in_RDI + 0x4ec) = *(ushort *)(in_RDI + 0x4ec) & 0xfcff | (ushort)bVar10 << 8;
      }
    }
    bVar10 = 1;
  }
LAB_0018b008:
  local_6c = 1;
  LTFlightData::FDKeyTy::~FDKeyTy((FDKeyTy *)0x18b015);
LAB_0018b015:
  return (bool)(bVar10 & 1);
}

Assistant:

bool ADSBHubConnection::StreamProcessDataVRSLine (const uint8_t* pStart)
{
    // end of line, based on fact that line length is stored in first byte
    const size_t len = size_t(pStart[0]);
    if (len < 10) {
        LOG_MSG(logDEBUG, "Ignoring too short a message of length %d", int(len));
        return false;
    }
    const uint8_t* const pEnd = pStart + len;
    
    // Skip over length, checksum, transmission type:
    pStart += 4;
    
    // next 3 bytes is the ADS-B hex id
    LTFlightData::FDKeyTy key (LTFlightData::KEY_ICAO,
                               (unsigned long)(pStart[0]) << 16 |
                               (unsigned long)(pStart[1]) <<  8 |
                               (unsigned long)(pStart[2]));
    pStart += 3;

    // Change of plane? Then process previous data first before continuing
    if (fdKey != key) {
        ProcessPlaneData();
        // New plane
        fdKey = key;
    }
    
    // remember list of fields and list of flags
    uint8_t fields = pStart[0];
    uint8_t flags  = pStart[1];
    pStart += 2;
    
    // --- process fields ---
    TEST_END("no fields processed")
    
    // Callsign
    if (fields & 0x01) {
        TEST_LEN(size_t(pStart[0]), "Call Sign");
        stat.call = VRSString(pStart);
    }

    // Altitude
    if (fields & 0x02) {
        TEST_LEN(3, "Altitude");
        pos.SetAltFt((double)VRSFloatInt(pStart));
    }
    
    // Ground Speed
    if (fields & 0x04) {
        TEST_LEN(2, "Ground Speed");
        dyn.spd = (double)VRSFloatShort(pStart);
    }
    
    // Track * 10.0
    if (fields & 0x08) {
        TEST_LEN(2, "Track");
        pos.heading() = dyn.heading = (double)VRSFloatShort(pStart) / 10.0;
    }
    
    // Latitude
    if (fields & 0x10) {
        TEST_LEN(4, "Latitude");
        pos.lat() = (double)VRSFloat(pStart);
    }
    
    // Longitude
    if (fields & 0x20) {
        TEST_LEN(4, "Longitude");
        pos.lon() = (double)VRSFloat(pStart);
    }
    
    // Vertical Speed
    if (fields & 0x40) {
        TEST_LEN(2, "VSI");
        dyn.vsi = (double)VRSFloatShort(pStart);
    }
    
    // Squawk
    if (fields & 0x80) {
        TEST_LEN(2, "Squawk");
        dyn.radar.code = (long)VRSShort(pStart);
    }

    // --- Flags ---
    if (flags) {
        TEST_LEN(1, "Flags");
        // Only one we are interested in is 'On ground'
        if (flags & 0x08) {
            pos.f.onGrnd =
                (pStart[0] & 0x08) ? GND_ON : GND_OFF;
        }
        ++pStart;
    }
    
    return true;
}